

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

ssize_t ssl_cf_send(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t blen,_Bool eos,CURLcode *err)

{
  long *plVar1;
  CURLcode CVar2;
  long lVar3;
  ulong uVar4;
  Curl_cfilter *pCVar5;
  _Bool done;
  _Bool local_39;
  Curl_cfilter *local_38;
  
  plVar1 = (long *)cf->ctx;
  *err = CURLE_OK;
  pCVar5 = (Curl_cfilter *)plVar1[9];
  plVar1[9] = (long)data;
  if ((int)plVar1[0x17] == 1) {
    local_39 = false;
    local_38 = cf;
    CVar2 = ssl_cf_connect_deferred(cf,data,buf,blen,&local_39);
    *err = CVar2;
    cf = local_38;
    if (CVar2 == CURLE_OK) {
      if (local_39 != false) goto LAB_00173095;
      *err = CURLE_AGAIN;
    }
    blen = 0xffffffffffffffff;
  }
  else {
LAB_00173095:
    uVar4 = plVar1[0x16];
    if (uVar4 != 0) {
      if (blen <= uVar4) {
        plVar1[0x16] = uVar4 - blen;
        *err = CURLE_OK;
        goto LAB_00173118;
      }
      buf = (void *)((long)buf + uVar4);
      blen = blen - uVar4;
      plVar1[0x16] = 0;
    }
    local_38 = pCVar5;
    if (blen == 0) {
      lVar3 = 0;
    }
    else {
      lVar3 = (**(code **)(*plVar1 + 0xb0))(cf,data,buf,blen,err);
      if (lVar3 < 0) {
        uVar4 = 0;
      }
    }
    blen = lVar3 + uVar4;
    pCVar5 = local_38;
  }
LAB_00173118:
  *(Curl_cfilter **)((long)cf->ctx + 0x48) = pCVar5;
  return blen;
}

Assistant:

static ssize_t ssl_cf_send(struct Curl_cfilter *cf,
                           struct Curl_easy *data,
                           const void *buf, size_t blen,
                           bool eos, CURLcode *err)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct cf_call_data save;
  ssize_t nwritten = 0, early_written = 0;

  (void)eos;
  *err = CURLE_OK;
  CF_DATA_SAVE(save, cf, data);

  if(connssl->state == ssl_connection_deferred) {
    bool done = FALSE;
    *err = ssl_cf_connect_deferred(cf, data, buf, blen, &done);
    if(*err) {
      nwritten = -1;
      goto out;
    }
    else if(!done) {
      *err = CURLE_AGAIN;
      nwritten = -1;
      goto out;
    }
    DEBUGASSERT(connssl->state == ssl_connection_complete);
  }

  if(connssl->earlydata_skip) {
    if(connssl->earlydata_skip >= blen) {
      connssl->earlydata_skip -= blen;
      *err = CURLE_OK;
      nwritten = (ssize_t)blen;
      goto out;
    }
    else {
      early_written = connssl->earlydata_skip;
      buf = ((const char *)buf) + connssl->earlydata_skip;
      blen -= connssl->earlydata_skip;
      connssl->earlydata_skip = 0;
    }
  }

  /* OpenSSL and maybe other TLS libs do not like 0-length writes. Skip. */
  if(blen > 0)
    nwritten = connssl->ssl_impl->send_plain(cf, data, buf, blen, err);

  if(nwritten >= 0)
    nwritten += early_written;

out:
  CF_DATA_RESTORE(cf, save);
  return nwritten;
}